

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall
doctest::anon_unknown_15::JUnitReporter::test_case_exception
          (JUnitReporter *this,TestCaseException *e)

{
  pointer *ppJVar1;
  int *piVar2;
  pointer pJVar3;
  pointer __first;
  _Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
  *this_00;
  pointer __result;
  pointer pJVar4;
  pointer pJVar5;
  long lVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  char *__s;
  pthread_mutex_t *__mutex;
  allocator<char> local_92;
  allocator<char> local_91;
  pthread_mutex_t *local_90;
  _Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
  *local_88;
  pointer local_80;
  pointer local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  
  __mutex = (pthread_mutex_t *)&this->mutex;
  std::mutex::lock((mutex *)&__mutex->__data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xffffffffffffffb0,"exception",&local_91);
  if ((e->error_string).field_0.buf[0x17] < '\0') {
    e = (TestCaseException *)(e->error_string).field_0.data.ptr;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,(char *)e,&local_92);
  pJVar3 = (this->testCaseData).testcases.
           super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pJVar5 = pJVar3[-1].errors.
           super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pJVar5 == pJVar3[-1].errors.
                super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    this_00 = (_Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
               *)std::
                 vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                 ::_M_check_len(&pJVar3[-1].errors,(size_type)e,__s);
    local_78 = pJVar3[-1].errors.
               super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_80 = pJVar3[-1].errors.
               super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    __result = std::
               _Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
               ::_M_allocate(this_00,(size_t)e);
    __first = local_78;
    local_90 = __mutex;
    local_88 = this_00;
    std::
    allocator_traits<std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>>
    ::
    construct<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,std::__cxx11::string_const&,std::__cxx11::string_const&>
              ((allocator_type *)(((long)pJVar5 - (long)local_78) + (long)__result),
               (JUnitTestMessage *)&stack0xffffffffffffffb0,&local_70,in_RCX);
    pJVar4 = std::
             vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
             ::_S_relocate(__first,pJVar5,__result,(_Tp_alloc_type *)in_RCX);
    pJVar5 = std::
             vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
             ::_S_relocate(pJVar5,local_80,pJVar4 + 1,(_Tp_alloc_type *)in_RCX);
    lVar6 = (long)pJVar3[-1].errors.
                  super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__first;
    std::
    _Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
    ::_M_deallocate((_Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                     *)__first,(pointer)(lVar6 / 0x60),lVar6 % 0x60);
    pJVar3[-1].errors.
    super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
    ._M_impl.super__Vector_impl_data._M_start = __result;
    pJVar3[-1].errors.
    super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
    ._M_impl.super__Vector_impl_data._M_finish = pJVar5;
    pJVar3[-1].errors.
    super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + (long)local_88;
    __mutex = local_90;
  }
  else {
    std::
    allocator_traits<std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>>
    ::
    construct<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,std::__cxx11::string_const&,std::__cxx11::string_const&>
              ((allocator_type *)pJVar5,(JUnitTestMessage *)&stack0xffffffffffffffb0,&local_70,
               in_RCX);
    ppJVar1 = &pJVar3[-1].errors.
               super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppJVar1 = *ppJVar1 + 1;
  }
  piVar2 = &(this->testCaseData).totalErrors;
  *piVar2 = *piVar2 + 1;
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void test_case_exception(const TestCaseException& e) override {
            DOCTEST_LOCK_MUTEX(mutex)
            testCaseData.addError("exception", e.error_string.c_str());
        }